

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_pcg.c
# Opt level: O1

SUNErrCode
SUNLinSolSetPreconditioner_PCG(SUNLinearSolver S,void *PData,SUNPSetupFn Psetup,SUNPSolveFn Psolve)

{
  void *pvVar1;
  
  pvVar1 = S->content;
  *(SUNPSetupFn *)((long)pvVar1 + 0x30) = Psetup;
  *(SUNPSolveFn *)((long)pvVar1 + 0x38) = Psolve;
  *(void **)((long)pvVar1 + 0x40) = PData;
  return 0;
}

Assistant:

SUNErrCode SUNLinSolSetPreconditioner_PCG(SUNLinearSolver S, void* PData,
                                          SUNPSetupFn Psetup, SUNPSolveFn Psolve)
{
  /* set function pointers to integrator-supplied Psetup and PSolve
     routines and data, and return with success */
  PCG_CONTENT(S)->Psetup = Psetup;
  PCG_CONTENT(S)->Psolve = Psolve;
  PCG_CONTENT(S)->PData  = PData;
  return SUN_SUCCESS;
}